

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::TriangleFillTest::render
          (TriangleFillTest *this,Context *ctx)

{
  WindowRectangle *value;
  int *value_00;
  int *value_01;
  int *value_02;
  ostringstream *poVar1;
  ostringstream *this_00;
  TestLog *pTVar2;
  pointer pFVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  MessageBuilder *pMVar7;
  long lVar8;
  Vec4 *p;
  Vec4 *p_00;
  ulong uVar9;
  long lVar10;
  string v2Properties;
  string v1Properties;
  string v0Properties;
  undefined1 local_308 [384];
  PositionColorShader program;
  
  PositionColorShader::PositionColorShader(&program);
  uVar4 = (*ctx->_vptr_Context[0x75])(ctx,&program);
  uVar5 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar4,"a_position");
  uVar6 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)uVar4,"a_color");
  pTVar2 = ((this->super_FillTest).super_RenderTestCase.super_TestCase.super_TestCase.super_TestNode
           .m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_308 + 8);
  local_308._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Viewport: left=");
  value = &(this->super_FillTest).m_viewport;
  pMVar7 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_308,&value->left);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tbottom=");
  value_00 = &(this->super_FillTest).m_viewport.bottom;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value_00);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\twidth=");
  value_01 = &(this->super_FillTest).m_viewport.width;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value_01);
  std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\theight=");
  value_02 = &(this->super_FillTest).m_viewport.height;
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,value_02);
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_308 + 8);
  local_308._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Rendering triangles. Coordinates:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_308 + 8);
  this_00 = (ostringstream *)(local_308 + 8);
  lVar10 = 0x4c;
  uVar9 = 0;
  while( true ) {
    pFVar3 = (this->m_triangles).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->m_triangles).
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar3;
    if ((ulong)(lVar8 / 0x60) <= uVar9) break;
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v0Properties,(_anonymous_namespace_ *)((long)(pFVar3->v0).m_data + lVar10 + -0x4c),
               (Vec4 *)(lVar8 % 0x60));
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v1Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_triangles).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start)->v0).m_data + lVar10 + -0x2c),p);
    Functional::(anonymous_namespace)::genClippingPointInfoString_abi_cxx11_
              (&v2Properties,
               (_anonymous_namespace_ *)
               ((long)(((this->m_triangles).
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                        ._M_impl.super__Vector_impl_data._M_start)->v0).m_data + lVar10 + -0xc),p_00
              );
    local_308._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"\tv0 (x=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_308,
                        (float *)((long)(((this->m_triangles).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                 lVar10 + -0x4c));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\ty=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -0x48));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tz=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -0x44));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tw=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(&((this->m_triangles).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->v0 +
                                               -4) + lVar10));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")\t");
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)&v0Properties);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    local_308._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"\tv1 (x=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_308,
                        (float *)((long)(((this->m_triangles).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                 lVar10 + -0x2c));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\ty=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -0x28));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tz=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -0x24));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tw=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(&((this->m_triangles).
                                                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->v0 +
                                               -2) + lVar10));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")\t");
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)&v1Properties);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    local_308._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_308 + 8));
    std::operator<<((ostream *)(local_308 + 8),"\tv2 (x=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_308,
                        (float *)((long)(((this->m_triangles).
                                          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->v0).m_data +
                                 lVar10 + -0xc));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\ty=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -8));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tz=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10 + -4));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"\tw=");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(float *)((long)(((this->m_triangles).
                                                 super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->v0).
                                               m_data + lVar10));
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")\t");
    std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)&v2Properties);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_308 + 8));
    local_308._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_308 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_308,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_308 + 8));
    std::__cxx11::string::~string((string *)&v2Properties);
    std::__cxx11::string::~string((string *)&v1Properties);
    std::__cxx11::string::~string((string *)&v0Properties);
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x60;
  }
  (*ctx->_vptr_Context[0x2a])(0,0,0,0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2b])(0x3f800000,ctx);
  (*ctx->_vptr_Context[0x2d])(ctx,0x4100);
  (*ctx->_vptr_Context[5])
            (ctx,(ulong)(uint)value->left,(ulong)(uint)*value_00,(ulong)(uint)*value_01,
             (ulong)(uint)*value_02);
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)uVar4);
  (*ctx->_vptr_Context[0x41])(ctx,1);
  (*ctx->_vptr_Context[0x33])(ctx,0xbe2);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar5);
  (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar6);
  (*ctx->_vptr_Context[0x4e])
            (ctx,(ulong)uVar5,4,0x1406,0,0x20,
             (this->m_triangles).
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
             ._M_impl.super__Vector_impl_data._M_start);
  (*ctx->_vptr_Context[0x4e])
            (ctx,(ulong)uVar6,4,0x1406,0,0x20,
             &((this->m_triangles).
               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start)->c0);
  (*ctx->_vptr_Context[0x68])
            (ctx,4,0,(ulong)(uint)((int)(((long)(this->m_triangles).
                                                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_triangles).
                                               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::TriangleFillTest::FillTriangle>_>
                                               ._M_impl.super__Vector_impl_data._M_start) / 0x60) *
                                  3));
  (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar5);
  (*ctx->_vptr_Context[0x51])(ctx,(ulong)uVar6);
  (*ctx->_vptr_Context[0x76])(ctx,0);
  (*ctx->_vptr_Context[0x77])(ctx,(ulong)uVar4);
  (*ctx->_vptr_Context[0x7a])(ctx);
  sglr::ShaderProgram::~ShaderProgram(&program.super_ShaderProgram);
  return;
}

Assistant:

void TriangleFillTest::render (sglr::Context& ctx)
{
	const int			verticesPerTriangle		= 3;
	PositionColorShader program;
	const deUint32		programId				= ctx.createProgram(&program);
	const GLint			positionLoc				= ctx.getAttribLocation(programId, "a_position");
	const GLint			colorLoc				= ctx.getAttribLocation(programId, "a_color");
	tcu::TestLog&		log						= m_testCtx.getLog();

	// log the purpose of the test
	log << TestLog::Message << "Viewport: left=" << m_viewport.left << "\tbottom=" << m_viewport.bottom << "\twidth=" << m_viewport.width << "\theight=" << m_viewport.height << TestLog::EndMessage;
	log << TestLog::Message << "Rendering triangles. Coordinates:" << TestLog::EndMessage;
	for (size_t ndx = 0; ndx < m_triangles.size(); ++ndx)
	{
		const std::string v0Properties = genClippingPointInfoString(m_triangles[ndx].v0);
		const std::string v1Properties = genClippingPointInfoString(m_triangles[ndx].v1);
		const std::string v2Properties = genClippingPointInfoString(m_triangles[ndx].v2);

		log << TestLog::Message << "\tv0 (x=" << m_triangles[ndx].v0.x() << "\ty=" << m_triangles[ndx].v0.y() << "\tz=" << m_triangles[ndx].v0.z() << "\tw=" << m_triangles[ndx].v0.w() << ")\t" << v0Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv1 (x=" << m_triangles[ndx].v1.x() << "\ty=" << m_triangles[ndx].v1.y() << "\tz=" << m_triangles[ndx].v1.z() << "\tw=" << m_triangles[ndx].v1.w() << ")\t" << v1Properties << TestLog::EndMessage;
		log << TestLog::Message << "\tv2 (x=" << m_triangles[ndx].v2.x() << "\ty=" << m_triangles[ndx].v2.y() << "\tz=" << m_triangles[ndx].v2.z() << "\tw=" << m_triangles[ndx].v2.w() << ")\t" << v2Properties << TestLog::EndMessage;
		log << TestLog::Message << TestLog::EndMessage;
	}

	ctx.clearColor					(0, 0, 0, 1);
	ctx.clearDepthf					(1.0f);
	ctx.clear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	ctx.viewport					(m_viewport.left, m_viewport.bottom, m_viewport.width, m_viewport.height);
	ctx.useProgram					(programId);
	ctx.blendFunc					(GL_ONE, GL_ONE);
	ctx.enable						(GL_BLEND);
	ctx.enableVertexAttribArray		(positionLoc);
	ctx.enableVertexAttribArray		(colorLoc);
	ctx.vertexAttribPointer			(positionLoc,	4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].v0);
	ctx.vertexAttribPointer			(colorLoc,		4, GL_FLOAT, GL_FALSE, sizeof(GLfloat[8]), &m_triangles[0].c0);
	ctx.drawArrays					(GL_TRIANGLES, 0, verticesPerTriangle * (glw::GLsizei)m_triangles.size());
	ctx.disableVertexAttribArray	(positionLoc);
	ctx.disableVertexAttribArray	(colorLoc);
	ctx.useProgram					(0);
	ctx.deleteProgram				(programId);
	ctx.finish						();
}